

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O2

bool ImGui_ImplSDL2_ProcessEvent(SDL_Event *event)

{
  char cVar1;
  Uint32 UVar2;
  int iVar3;
  ImGuiIO *this;
  ulong uVar4;
  
  this = ImGui::GetIO();
  UVar2 = event->type;
  if (UVar2 - 0x300 < 2) {
    uVar4 = (ulong)(event->key).keysym.scancode;
    if (0x1ff < uVar4) {
      __assert_fail("key >= 0 && key < ((int)(sizeof(io.KeysDown) / sizeof(*io.KeysDown)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/examples/imgui_impl_sdl.cpp"
                    ,0x73,"bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event *)");
    }
    this->KeysDown[uVar4] = UVar2 == 0x300;
    uVar4 = SDL_GetModState();
    this->KeyShift = (uVar4 & 3) != 0;
    uVar4 = SDL_GetModState();
    this->KeyCtrl = (uVar4 & 0xc0) != 0;
    uVar4 = SDL_GetModState();
    this->KeyAlt = (uVar4 & 0x300) != 0;
    uVar4 = SDL_GetModState();
    this->KeySuper = (uVar4 & 0xc00) != 0;
  }
  else {
    if (UVar2 != 0x303) {
      if (UVar2 == 0x401) {
        cVar1 = (event->edit).text[4];
        if (cVar1 == '\x03') {
          _ZL14g_MousePressed_1 = 1;
          return true;
        }
        if (cVar1 != '\x02') {
          if (cVar1 != '\x01') {
            return true;
          }
          _ZL14g_MousePressed_0 = 1;
          return true;
        }
        _ZL14g_MousePressed_2 = 1;
        return true;
      }
      if (UVar2 != 0x403) {
        return false;
      }
      iVar3 = (event->display).data1;
      if (0 < iVar3) {
        this->MouseWheelH = this->MouseWheelH + 1.0;
        iVar3 = (event->display).data1;
      }
      if (iVar3 < 0) {
        this->MouseWheelH = this->MouseWheelH + -1.0;
      }
      iVar3 = (event->window).data2;
      if (0 < iVar3) {
        this->MouseWheel = this->MouseWheel + 1.0;
        iVar3 = (event->window).data2;
      }
      if (-1 < iVar3) {
        return true;
      }
      this->MouseWheel = this->MouseWheel + -1.0;
      return true;
    }
    ImGuiIO::AddInputCharactersUTF8(this,(event->edit).text);
  }
  return true;
}

Assistant:

bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event* event)
{
    ImGuiIO& io = ImGui::GetIO();
    switch (event->type)
    {
    case SDL_MOUSEWHEEL:
        {
            if (event->wheel.x > 0) io.MouseWheelH += 1;
            if (event->wheel.x < 0) io.MouseWheelH -= 1;
            if (event->wheel.y > 0) io.MouseWheel += 1;
            if (event->wheel.y < 0) io.MouseWheel -= 1;
            return true;
        }
    case SDL_MOUSEBUTTONDOWN:
        {
            if (event->button.button == SDL_BUTTON_LEFT) g_MousePressed[0] = true;
            if (event->button.button == SDL_BUTTON_RIGHT) g_MousePressed[1] = true;
            if (event->button.button == SDL_BUTTON_MIDDLE) g_MousePressed[2] = true;
            return true;
        }
    case SDL_TEXTINPUT:
        {
            io.AddInputCharactersUTF8(event->text.text);
            return true;
        }
    case SDL_KEYDOWN:
    case SDL_KEYUP:
        {
            int key = event->key.keysym.scancode;
            IM_ASSERT(key >= 0 && key < IM_ARRAYSIZE(io.KeysDown));
            io.KeysDown[key] = (event->type == SDL_KEYDOWN);
            io.KeyShift = ((SDL_GetModState() & KMOD_SHIFT) != 0);
            io.KeyCtrl = ((SDL_GetModState() & KMOD_CTRL) != 0);
            io.KeyAlt = ((SDL_GetModState() & KMOD_ALT) != 0);
#ifdef _WIN32
            io.KeySuper = false;
#else
            io.KeySuper = ((SDL_GetModState() & KMOD_GUI) != 0);
#endif
            return true;
        }
    }
    return false;
}